

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_Extensions_Test::TestBody
          (GeneratedMessageReflectionSwapTest_Extensions_Test *this)

{
  Reflection *reflection;
  undefined1 local_70 [8];
  TestAllExtensions rhs;
  TestAllExtensions lhs;
  GeneratedMessageReflectionSwapTest_Extensions_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&rhs.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&rhs.field_0._impl_._cached_size_);
  reflection = proto2_unittest::TestAllExtensions::GetReflection();
  GeneratedMessageReflectionSwapTest::Swap
            (&this->super_GeneratedMessageReflectionSwapTest,reflection,
             (Message *)&rhs.field_0._impl_._cached_size_,(Message *)local_70);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&rhs.field_0._impl_._cached_size_);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&rhs.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, Extensions) {
  unittest::TestAllExtensions lhs;
  unittest::TestAllExtensions rhs;

  TestUtil::SetAllExtensions(&lhs);

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectExtensionsClear(lhs);
  TestUtil::ExpectAllExtensionsSet(rhs);
}